

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathCmpNodesExt(xmlNodePtr node1,xmlNodePtr node2)

{
  xmlElementType xVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  _xmlNode *p_Var4;
  bool bVar5;
  int iVar6;
  _xmlNode *p_Var7;
  xmlNodePtr pxVar8;
  xmlNodePtr pxVar9;
  xmlNodePtr pxVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  
  if (node2 == (xmlNodePtr)0x0 || node1 == (xmlNodePtr)0x0) {
    return -2;
  }
  if (node1 == node2) {
    return 0;
  }
  xVar1 = node1->type;
  bVar5 = false;
  pxVar8 = node1;
  if (xVar1 < XML_XINCLUDE_START) {
    if ((0x198U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
      if (xVar1 != XML_ATTRIBUTE_NODE) {
        if (xVar1 == XML_NAMESPACE_DECL) {
          return 1;
        }
        goto LAB_001e76d4;
      }
      pxVar8 = node1->parent;
      bVar5 = true;
      uVar13 = 1;
    }
    else {
      p_Var7 = node1->prev;
      while (p_Var7 != (_xmlNode *)0x0) {
        pxVar8 = pxVar8->prev;
        if (pxVar8->type == XML_ELEMENT_NODE) {
          uVar13 = 3;
          goto LAB_001e770c;
        }
        p_Var7 = pxVar8->prev;
      }
      pxVar8 = pxVar8->parent;
      uVar13 = 2;
LAB_001e770c:
      if (((pxVar8 == (xmlNodePtr)0x0) || (pxVar8->type != XML_ELEMENT_NODE)) ||
         (-1 < (long)pxVar8->content)) {
        uVar13 = 0;
        pxVar8 = node1;
      }
      else {
        bVar5 = true;
      }
    }
  }
  else {
LAB_001e76d4:
    if ((xVar1 == XML_ELEMENT_NODE) && (node2->type == XML_ELEMENT_NODE)) {
      pxVar2 = node1->content;
      if ((-1 < (long)pxVar2) ||
         ((pxVar3 = node2->content, -1 < (long)pxVar3 || (node1->doc != node2->doc))))
      goto LAB_001e788b;
      if ((long)pxVar3 < (long)pxVar2) {
        return 1;
      }
      if ((long)pxVar2 < (long)pxVar3) {
        return -1;
      }
    }
    bVar5 = false;
    uVar13 = 0;
    node1 = (_xmlNode *)0x0;
  }
  xVar1 = node2->type;
  uVar14 = 0;
  pxVar10 = node2;
  if (xVar1 < XML_XINCLUDE_START) {
    if ((0x198U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
      if (xVar1 == XML_ATTRIBUTE_NODE) {
        bVar5 = true;
        pxVar10 = node2->parent;
        uVar14 = 1;
      }
      else {
        node2 = (xmlNodePtr)0x0;
        uVar14 = 0;
        if (xVar1 == XML_NAMESPACE_DECL) {
          return 1;
        }
      }
    }
    else {
      p_Var7 = node2->prev;
      pxVar9 = node2;
      while (p_Var7 != (_xmlNode *)0x0) {
        pxVar9 = pxVar9->prev;
        if (pxVar9->type == XML_ELEMENT_NODE) {
          uVar15 = 3;
          goto LAB_001e77c2;
        }
        p_Var7 = pxVar9->prev;
      }
      pxVar9 = pxVar9->parent;
      uVar15 = 2;
LAB_001e77c2:
      if (((pxVar9 != (xmlNodePtr)0x0) && (pxVar9->type == XML_ELEMENT_NODE)) &&
         ((long)pxVar9->content < 0)) {
        bVar5 = true;
        pxVar10 = pxVar9;
        uVar14 = uVar15;
      }
    }
  }
  else {
    node2 = (xmlNodePtr)0x0;
    uVar14 = 0;
  }
  if (bVar5) {
    if (pxVar8 == pxVar10) {
      if (uVar13 != uVar14) {
        return (uint)(uVar13 < uVar14) * 2 + -1;
      }
      while( true ) {
        node2 = node2->prev;
        if (node2 == (_xmlNode *)0x0) {
          return -1;
        }
        if (node2 == node1) break;
        if (node2->type == XML_ELEMENT_NODE) {
          return -1;
        }
      }
      return 1;
    }
    p_Var7 = pxVar8;
    if (1 < uVar13 && uVar14 == 3) {
      while (p_Var7 = p_Var7->parent, p_Var7 != (_xmlNode *)0x0) {
        if (p_Var7 == pxVar10) {
          return 1;
        }
      }
    }
    pxVar9 = pxVar10;
    if (1 < uVar14 && uVar13 == 3) {
      while (pxVar9 = pxVar9->parent, pxVar9 != (xmlNodePtr)0x0) {
        if (pxVar9 == pxVar8) {
          return -1;
        }
      }
    }
  }
  node1 = pxVar8;
  node2 = pxVar10;
  if (((pxVar8->type == XML_ELEMENT_NODE) && (pxVar10->type == XML_ELEMENT_NODE)) &&
     ((pxVar2 = pxVar8->content, (long)pxVar2 < 0 &&
      ((pxVar3 = pxVar10->content, (long)pxVar3 < 0 && (pxVar8->doc == pxVar10->doc)))))) {
    if ((long)pxVar3 < (long)pxVar2) {
      return 1;
    }
    if ((long)pxVar2 < (long)pxVar3) {
      return -1;
    }
  }
LAB_001e788b:
  if (node1 == node2->prev) {
    return 1;
  }
  if (node1 == node2->next) {
    return -1;
  }
  iVar12 = 0;
  iVar11 = 0;
  pxVar8 = node2;
  if (node2->parent != (xmlNodePtr)0x0) {
    iVar11 = 0;
    pxVar10 = node2->parent;
    do {
      pxVar8 = pxVar10;
      if (pxVar8 == node1) {
        return 1;
      }
      iVar11 = iVar11 + 1;
      pxVar10 = pxVar8->parent;
    } while (pxVar8->parent != (_xmlNode *)0x0);
  }
  pxVar10 = node1;
  if (node1->parent != (_xmlNode *)0x0) {
    iVar12 = 0;
    p_Var7 = node1->parent;
    do {
      pxVar10 = p_Var7;
      if (pxVar10 == node2) {
        return -1;
      }
      iVar12 = iVar12 + 1;
      p_Var7 = pxVar10->parent;
    } while (pxVar10->parent != (_xmlNode *)0x0);
  }
  iVar6 = iVar12;
  if (pxVar8 == pxVar10) {
    for (; iVar11 < iVar12; iVar12 = iVar12 + -1) {
      node1 = node1->parent;
      iVar6 = iVar11;
    }
    for (; iVar6 < iVar11; iVar11 = iVar11 + -1) {
      node2 = node2->parent;
    }
    do {
      p_Var7 = node1->parent;
      p_Var4 = node2->parent;
      if (p_Var7 == p_Var4) {
        if (node1 == node2->prev) {
          return 1;
        }
        if (node1 == node2->next) {
          return -1;
        }
        if ((((node1->type == XML_ELEMENT_NODE) && (node2->type == XML_ELEMENT_NODE)) &&
            (pxVar2 = node1->content, (long)pxVar2 < 0)) &&
           ((pxVar3 = node2->content, (long)pxVar3 < 0 && (node1->doc == node2->doc)))) {
          if ((long)pxVar3 < (long)pxVar2) {
            return 1;
          }
          if ((long)pxVar2 < (long)pxVar3) {
            return -1;
          }
        }
        do {
          node1 = node1->next;
          if (node1 == (_xmlNode *)0x0) {
            return -1;
          }
        } while (node1 != node2);
        return 1;
      }
    } while ((p_Var7 != (_xmlNode *)0x0) &&
            (node1 = p_Var7, node2 = p_Var4, p_Var4 != (_xmlNode *)0x0));
  }
  return -2;
}

Assistant:

static int
xmlXPathCmpNodesExt(xmlNodePtr node1, xmlNodePtr node2) {
    int depth1, depth2;
    int misc = 0, precedence1 = 0, precedence2 = 0;
    xmlNodePtr miscNode1 = NULL, miscNode2 = NULL;
    xmlNodePtr cur, root;
    ptrdiff_t l1, l2;

    if ((node1 == NULL) || (node2 == NULL))
	return(-2);

    if (node1 == node2)
	return(0);

    /*
     * a couple of optimizations which will avoid computations in most cases
     */
    switch (node1->type) {
	case XML_ELEMENT_NODE:
	    if (node2->type == XML_ELEMENT_NODE) {
		if ((0 > (ptrdiff_t) node1->content) &&
		    (0 > (ptrdiff_t) node2->content) &&
		    (node1->doc == node2->doc))
		{
		    l1 = -((ptrdiff_t) node1->content);
		    l2 = -((ptrdiff_t) node2->content);
		    if (l1 < l2)
			return(1);
		    if (l1 > l2)
			return(-1);
		} else
		    goto turtle_comparison;
	    }
	    break;
	case XML_ATTRIBUTE_NODE:
	    precedence1 = 1; /* element is owner */
	    miscNode1 = node1;
	    node1 = node1->parent;
	    misc = 1;
	    break;
	case XML_TEXT_NODE:
	case XML_CDATA_SECTION_NODE:
	case XML_COMMENT_NODE:
	case XML_PI_NODE: {
	    miscNode1 = node1;
	    /*
	    * Find nearest element node.
	    */
	    if (node1->prev != NULL) {
		do {
		    node1 = node1->prev;
		    if (node1->type == XML_ELEMENT_NODE) {
			precedence1 = 3; /* element in prev-sibl axis */
			break;
		    }
		    if (node1->prev == NULL) {
			precedence1 = 2; /* element is parent */
			/*
			* URGENT TODO: Are there any cases, where the
			* parent of such a node is not an element node?
			*/
			node1 = node1->parent;
			break;
		    }
		} while (1);
	    } else {
		precedence1 = 2; /* element is parent */
		node1 = node1->parent;
	    }
	    if ((node1 == NULL) || (node1->type != XML_ELEMENT_NODE) ||
		(0 <= (ptrdiff_t) node1->content)) {
		/*
		* Fallback for whatever case.
		*/
		node1 = miscNode1;
		precedence1 = 0;
	    } else
		misc = 1;
	}
	    break;
	case XML_NAMESPACE_DECL:
	    /*
	    * TODO: why do we return 1 for namespace nodes?
	    */
	    return(1);
	default:
	    break;
    }
    switch (node2->type) {
	case XML_ELEMENT_NODE:
	    break;
	case XML_ATTRIBUTE_NODE:
	    precedence2 = 1; /* element is owner */
	    miscNode2 = node2;
	    node2 = node2->parent;
	    misc = 1;
	    break;
	case XML_TEXT_NODE:
	case XML_CDATA_SECTION_NODE:
	case XML_COMMENT_NODE:
	case XML_PI_NODE: {
	    miscNode2 = node2;
	    if (node2->prev != NULL) {
		do {
		    node2 = node2->prev;
		    if (node2->type == XML_ELEMENT_NODE) {
			precedence2 = 3; /* element in prev-sibl axis */
			break;
		    }
		    if (node2->prev == NULL) {
			precedence2 = 2; /* element is parent */
			node2 = node2->parent;
			break;
		    }
		} while (1);
	    } else {
		precedence2 = 2; /* element is parent */
		node2 = node2->parent;
	    }
	    if ((node2 == NULL) || (node2->type != XML_ELEMENT_NODE) ||
		(0 <= (ptrdiff_t) node2->content))
	    {
		node2 = miscNode2;
		precedence2 = 0;
	    } else
		misc = 1;
	}
	    break;
	case XML_NAMESPACE_DECL:
	    return(1);
	default:
	    break;
    }
    if (misc) {
	if (node1 == node2) {
	    if (precedence1 == precedence2) {
		/*
		* The ugly case; but normally there aren't many
		* adjacent non-element nodes around.
		*/
		cur = miscNode2->prev;
		while (cur != NULL) {
		    if (cur == miscNode1)
			return(1);
		    if (cur->type == XML_ELEMENT_NODE)
			return(-1);
		    cur = cur->prev;
		}
		return (-1);
	    } else {
		/*
		* Evaluate based on higher precedence wrt to the element.
		* TODO: This assumes attributes are sorted before content.
		*   Is this 100% correct?
		*/
		if (precedence1 < precedence2)
		    return(1);
		else
		    return(-1);
	    }
	}
	/*
	* Special case: One of the helper-elements is contained by the other.
	* <foo>
	*   <node2>
	*     <node1>Text-1(precedence1 == 2)</node1>
	*   </node2>
	*   Text-6(precedence2 == 3)
	* </foo>
	*/
	if ((precedence2 == 3) && (precedence1 > 1)) {
	    cur = node1->parent;
	    while (cur) {
		if (cur == node2)
		    return(1);
		cur = cur->parent;
	    }
	}
	if ((precedence1 == 3) && (precedence2 > 1)) {
	    cur = node2->parent;
	    while (cur) {
		if (cur == node1)
		    return(-1);
		cur = cur->parent;
	    }
	}
    }

    /*
     * Speedup using document order if available.
     */
    if ((node1->type == XML_ELEMENT_NODE) &&
	(node2->type == XML_ELEMENT_NODE) &&
	(0 > (ptrdiff_t) node1->content) &&
	(0 > (ptrdiff_t) node2->content) &&
	(node1->doc == node2->doc)) {

	l1 = -((ptrdiff_t) node1->content);
	l2 = -((ptrdiff_t) node2->content);
	if (l1 < l2)
	    return(1);
	if (l1 > l2)
	    return(-1);
    }

turtle_comparison:

    if (node1 == node2->prev)
	return(1);
    if (node1 == node2->next)
	return(-1);
    /*
     * compute depth to root
     */
    for (depth2 = 0, cur = node2; cur->parent != NULL; cur = cur->parent) {
	if (cur->parent == node1)
	    return(1);
	depth2++;
    }
    root = cur;
    for (depth1 = 0, cur = node1; cur->parent != NULL; cur = cur->parent) {
	if (cur->parent == node2)
	    return(-1);
	depth1++;
    }
    /*
     * Distinct document (or distinct entities :-( ) case.
     */
    if (root != cur) {
	return(-2);
    }
    /*
     * get the nearest common ancestor.
     */
    while (depth1 > depth2) {
	depth1--;
	node1 = node1->parent;
    }
    while (depth2 > depth1) {
	depth2--;
	node2 = node2->parent;
    }
    while (node1->parent != node2->parent) {
	node1 = node1->parent;
	node2 = node2->parent;
	/* should not happen but just in case ... */
	if ((node1 == NULL) || (node2 == NULL))
	    return(-2);
    }
    /*
     * Find who's first.
     */
    if (node1 == node2->prev)
	return(1);
    if (node1 == node2->next)
	return(-1);
    /*
     * Speedup using document order if available.
     */
    if ((node1->type == XML_ELEMENT_NODE) &&
	(node2->type == XML_ELEMENT_NODE) &&
	(0 > (ptrdiff_t) node1->content) &&
	(0 > (ptrdiff_t) node2->content) &&
	(node1->doc == node2->doc)) {

	l1 = -((ptrdiff_t) node1->content);
	l2 = -((ptrdiff_t) node2->content);
	if (l1 < l2)
	    return(1);
	if (l1 > l2)
	    return(-1);
    }

    for (cur = node1->next;cur != NULL;cur = cur->next)
	if (cur == node2)
	    return(1);
    return(-1); /* assume there is no sibling list corruption */
}